

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

size_t fct_ts__tst_cnt(fct_ts_t *ts)

{
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x51b
                  ,"size_t fct_ts__tst_cnt(const fct_ts_t *)");
  }
  if (ts->mode == ts_mode_end) {
    return (ts->test_list).used_itm_num;
  }
  __assert_fail("((ts)->mode == ts_mode_end) && \"can\'t count number of tests executed until the test suite ends\""
                ,"/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x51f,
                "size_t fct_ts__tst_cnt(const fct_ts_t *)");
}

Assistant:

static size_t
fct_ts__tst_cnt(fct_ts_t const *ts)
{
    FCT_ASSERT( ts != NULL );
    FCT_ASSERT(
        fct_ts__is_end(ts)
        && "can't count number of tests executed until the test suite ends"
    );
    return fct_nlist__size(&(ts->test_list));
}